

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamEuler::EvaluateSectionFrame
          (ChElementBeamEuler *this,double eta,ChVector<double> *point,ChQuaternion<double> *rot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer psVar5;
  element_type *peVar6;
  element_type *peVar7;
  double dVar8;
  double dVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [64];
  double dVar29;
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  ChVector<double> u_rotaz;
  ChVector<double> u_displ;
  double local_68;
  double dStack_60;
  double local_58;
  ulong local_48;
  double dStack_40;
  ulong local_38;
  undefined1 extraout_var [56];
  
  local_48 = 0;
  dStack_40 = 0.0;
  local_38 = 0;
  local_58 = 0.0;
  local_68 = 0.0;
  dStack_60 = 0.0;
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x16]
  )(this,&local_48,&local_68);
  dVar13 = local_58;
  dVar12 = dStack_60;
  dVar11 = local_68;
  dVar1 = (this->q_element_abs_rot).m_data[0];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar1;
  dVar2 = (this->q_element_abs_rot).m_data[3];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar2;
  dVar3 = (this->q_element_ref_rot).m_data[0];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar3;
  dVar29 = (this->q_element_ref_rot).m_data[3];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar29;
  psVar5 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar4 = (this->q_element_ref_rot).m_data[2];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar4;
  dVar27 = (this->q_element_ref_rot).m_data[1];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar27;
  auVar30 = ZEXT816(0xbff0000000000000);
  auVar32 = ZEXT816(0x4000000000000000);
  dVar31 = (this->q_element_abs_rot).m_data[2];
  auVar26._8_8_ = 0x8000000000000000;
  auVar26._0_8_ = 0x8000000000000000;
  auVar14 = vxorpd_avx512vl(auVar45,auVar26);
  peVar6 = (psVar5->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar7 = psVar5[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar8 = dVar1 * dVar1;
  dVar3 = dVar3 * dVar3;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = eta;
  auVar15 = vsubsd_avx512f(ZEXT816(0x3ff0000000000000),auVar69);
  auVar16 = vaddsd_avx512f(auVar69,ZEXT816(0x3ff0000000000000));
  auVar17 = vmulsd_avx512f(auVar47,auVar55);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar31;
  auVar18 = vmulsd_avx512f(auVar34,auVar70);
  auVar19 = vmulsd_avx512f(auVar47,auVar14);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar8 + dVar2 * dVar2;
  auVar26 = vfmadd213sd_fma(auVar41,auVar32,auVar30);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar3 + dVar29 * dVar29;
  auVar25 = vfmadd213sd_fma(auVar62,auVar32,auVar30);
  dVar9 = auVar15._0_8_ * 0.5;
  dVar29 = auVar16._0_8_ * 0.5;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (peVar7->X0).coord.pos.m_data[2];
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar29;
  auVar15 = vmulsd_avx512f(auVar67,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)&(peVar6->X0).coord.pos;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar9;
  auVar16 = vmulsd_avx512f(auVar64,auVar16);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)&(peVar7->X0).coord.pos;
  auVar20 = vmulsd_avx512f(auVar67,auVar20);
  dVar29 = dVar9 * (peVar6->X0).coord.pos.m_data[1] + dVar29 * (peVar7->X0).coord.pos.m_data[1];
  auVar21 = vmulsd_avx512f(auVar51,auVar14);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar9 * (peVar6->X0).coord.pos.m_data[2];
  auVar22 = vaddsd_avx512f(auVar66,auVar15);
  auVar15 = vmulsd_avx512f(auVar51,auVar55);
  auVar16 = vaddsd_avx512f(auVar16,auVar20);
  auVar20 = vmulsd_avx512f(auVar55,auVar14);
  auVar14 = vaddsd_avx512f(auVar21,auVar17);
  auVar23 = vsubsd_avx512f(auVar15,auVar19);
  auVar15 = vaddsd_avx512f(auVar19,auVar15);
  auVar19 = vmulsd_avx512f(auVar51,auVar51);
  dVar27 = dVar27 * dVar4;
  auVar17 = vsubsd_avx512f(auVar17,auVar21);
  auVar14 = vaddsd_avx512f(auVar14,auVar14);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar27;
  auVar21 = vsubsd_avx512f(auVar52,auVar20);
  dVar27 = dVar27 + auVar20._0_8_;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar3;
  auVar20 = vaddsd_avx512f(auVar59,auVar19);
  auVar19 = vaddsd_avx512f(auVar15,auVar15);
  auVar24 = vmulsd_avx512f(auVar37,auVar70);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar29;
  auVar14 = vmulsd_avx512f(auVar65,auVar14);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar3 + dVar4 * dVar4;
  auVar15 = vfmadd213sd_fma(auVar48,auVar32,auVar30);
  auVar21 = vaddsd_avx512f(auVar21,auVar21);
  auVar20 = vfmadd213sd_avx512f(auVar20,auVar32,auVar30);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = auVar23._0_8_ + auVar23._0_8_;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar16,auVar46);
  auVar21 = vmulsd_avx512f(auVar65,auVar21);
  auVar20 = vfmadd231sd_avx512f(auVar21,auVar16,auVar20);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar22,auVar25);
  dVar3 = (this->q_element_abs_rot).m_data[1];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar3;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar29 * auVar15._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar27 + dVar27;
  auVar15 = vfmadd231sd_avx512f(auVar49,auVar16,auVar53);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_38;
  auVar25 = vaddsd_avx512f(auVar14,auVar25);
  auVar16 = vfmadd231sd_avx512f(auVar20,auVar22,auVar19);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_48;
  auVar14 = vaddsd_avx512f(auVar16,auVar14);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = auVar17._0_8_ + auVar17._0_8_;
  auVar15 = vfmadd231sd_fma(auVar15,auVar22,auVar68);
  dVar29 = auVar15._0_8_ + dStack_40;
  auVar17 = vmulsd_avx512f(auVar37,auVar63);
  dVar4 = dVar3 * dVar1 + auVar24._0_8_;
  auVar15 = vsubsd_avx512f(auVar17,auVar18);
  auVar15 = vaddsd_avx512f(auVar15,auVar15);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar29 * (dVar4 + dVar4);
  auVar15 = vfmadd231sd_avx512f(auVar60,auVar14,auVar15);
  auVar20 = vfmadd231sd_fma(auVar15,auVar25,auVar26);
  dVar27 = auVar24._0_8_ - dVar3 * dVar1;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar31;
  auVar26 = vmulsd_avx512f(auVar63,auVar71);
  auVar15 = vmulsd_avx512f(auVar71,auVar71);
  dVar4 = auVar26._0_8_ + dVar1 * dVar2;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = auVar15._0_8_ + dVar8;
  auVar15 = vfmadd213sd_fma(auVar56,auVar32,auVar30);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar3 * dVar3 + dVar8;
  auVar16 = vfmadd213sd_fma(auVar19,auVar32,auVar30);
  dVar1 = auVar26._0_8_ - dVar1 * dVar2;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar4 + dVar4;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar29 * auVar15._0_8_;
  auVar15 = vfmadd231sd_avx512f(auVar57,auVar14,auVar38);
  auVar26 = vaddsd_avx512f(auVar17,auVar18);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar29 * (dVar1 + dVar1);
  auVar16 = vfmadd231sd_avx512f(auVar21,auVar14,auVar16);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar27 + dVar27;
  auVar15 = vfmadd231sd_fma(auVar15,auVar25,auVar42);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = auVar26._0_8_ + auVar26._0_8_;
  auVar16 = vfmadd231sd_fma(auVar16,auVar25,auVar39);
  point->m_data[0] = auVar16._0_8_;
  point->m_data[1] = auVar15._0_8_;
  point->m_data[2] = auVar20._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_68;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_58;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dStack_60 * dStack_60;
  auVar15 = vfmadd231sd_fma(auVar17,auVar22,auVar22);
  auVar15 = vfmadd231sd_fma(auVar15,auVar30,auVar30);
  auVar15 = vsqrtsd_avx(auVar15,auVar15);
  dVar29 = auVar15._0_8_;
  dVar27 = sin(dVar29 * 0.5);
  auVar28._0_8_ = cos(dVar29 * 0.5);
  auVar28._8_56_ = extraout_var;
  dVar1 = (this->q_element_abs_rot).m_data[2];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar1;
  dVar2 = (this->q_element_abs_rot).m_data[3];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (this->q_element_abs_rot).m_data[0];
  dVar3 = (this->q_element_abs_rot).m_data[1];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar3;
  dVar31 = 1.0 / dVar29;
  bVar10 = 2.2250738585072014e-308 <= dVar29;
  dVar29 = dVar27 * (double)((ulong)bVar10 * (long)(dVar31 * dVar12));
  dVar4 = dVar27 * (double)((ulong)bVar10 * (long)(dVar31 * dVar11) +
                           (ulong)!bVar10 * 0x3ff0000000000000);
  dVar27 = dVar27 * (double)((ulong)bVar10 * (long)(dVar31 * dVar13));
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar27;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar2 * auVar28._0_8_;
  auVar15 = vfmadd231sd_fma(auVar50,auVar18,auVar32);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar29;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = auVar28._0_8_ * dVar1;
  auVar16 = vfmadd231sd_fma(auVar54,auVar18,auVar35);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar4;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = auVar28._0_8_ * dVar3;
  auVar20 = vfmadd231sd_fma(auVar58,auVar18,auVar43);
  auVar25 = vfnmadd231sd_fma(auVar15,auVar40,auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar4;
  auVar15 = vfmadd231sd_fma(auVar16,auVar61,auVar44);
  auVar20 = vfnmadd231sd_fma(auVar20,auVar61,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar29;
  auVar16 = vfmadd231sd_fma(auVar25,auVar23,auVar36);
  auVar25 = vfnmadd231sd_fma(auVar15,auVar23,auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar27;
  auVar15 = vfmadd231sd_fma(auVar20,auVar40,auVar33);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar4 * dVar3;
  auVar20 = vfmsub231sd_fma(auVar24,auVar18,auVar28._0_16_);
  auVar20 = vfnmadd231sd_fma(auVar20,auVar40,auVar36);
  auVar20 = vfnmadd231sd_fma(auVar20,auVar61,auVar33);
  rot->m_data[0] = auVar20._0_8_;
  rot->m_data[1] = auVar15._0_8_;
  rot->m_data[2] = auVar25._0_8_;
  rot->m_data[3] = auVar16._0_8_;
  return;
}

Assistant:

void ChElementBeamEuler::EvaluateSectionFrame(const double eta, ChVector<>& point, ChQuaternion<>& rot) {
    ChVector<> u_displ;
    ChVector<> u_rotaz;
    double Nx1 = (1. / 2.) * (1 - eta);
    double Nx2 = (1. / 2.) * (1 + eta);

    this->EvaluateSectionDisplacement(eta, u_displ, u_rotaz);

    // Since   d = [Atw]' Xt - [A0w]'X0   , so we have
    //        Xt = [Atw] (d +  [A0w]'X0)

    point = this->q_element_abs_rot.Rotate(u_displ +
                                           this->q_element_ref_rot.RotateBack(Nx1 * this->nodes[0]->GetX0().GetPos() +
                                                                              Nx2 * this->nodes[1]->GetX0().GetPos()));

    ChQuaternion<> msectionrot;
    msectionrot.Q_from_AngAxis(u_rotaz.Length(), u_rotaz.GetNormalized());
    rot = this->q_element_abs_rot % msectionrot;
}